

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.c
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  char cVar2;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  bool bVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  char *pcVar25;
  ulong uVar26;
  undefined1 *puVar27;
  void *pvVar28;
  void *pvVar29;
  void *pvVar30;
  long lVar31;
  long lVar32;
  undefined8 uVar33;
  char **ppcVar34;
  ulong uVar35;
  size_t __size;
  char cVar36;
  char cVar38;
  char cVar39;
  char cVar40;
  char cVar41;
  char cVar42;
  char cVar43;
  char cVar44;
  char cVar45;
  char cVar47;
  char cVar48;
  char cVar49;
  char cVar50;
  char cVar51;
  char cVar52;
  undefined1 auVar37 [16];
  char cVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  short sVar61;
  short sVar62;
  undefined1 auVar69 [16];
  short sVar70;
  short sVar71;
  undefined1 auVar76 [12];
  undefined1 auVar81 [16];
  undefined4 uVar83;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  bench_schnorrsig_data data_1;
  uchar sk [32];
  bench_data data;
  secp256k1_ecdsa_signature sig;
  secp256k1_pubkey pubkey;
  int in_stack_fffffffffffffd98;
  undefined8 local_240 [2];
  void *local_230;
  void *local_228;
  void *local_220;
  void *local_218;
  long local_210;
  undefined1 local_208;
  undefined1 local_207;
  undefined1 local_206;
  undefined1 local_205;
  undefined8 local_204;
  undefined4 uStack_1fc;
  undefined4 uStack_1f8;
  undefined4 uStack_1f4;
  undefined8 uStack_1f0;
  undefined8 local_1e0;
  char local_1d8 [32];
  undefined1 local_1b8 [32];
  undefined1 local_198 [72];
  undefined8 local_150;
  undefined1 local_148 [40];
  undefined8 local_120;
  undefined8 local_118 [13];
  undefined1 local_b0 [64];
  undefined1 local_70 [64];
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  long lVar46;
  undefined4 uVar63;
  undefined6 uVar64;
  undefined1 auVar65 [12];
  undefined1 auVar66 [12];
  undefined1 auVar67 [14];
  undefined1 auVar68 [14];
  undefined4 uVar72;
  undefined6 uVar73;
  undefined8 uVar74;
  undefined1 auVar75 [12];
  undefined1 auVar77 [12];
  undefined1 auVar78 [14];
  undefined1 auVar79 [14];
  undefined1 auVar80 [14];
  undefined1 auVar82 [16];
  undefined6 uVar84;
  undefined8 uVar85;
  undefined1 auVar86 [12];
  undefined1 auVar87 [14];
  undefined1 auVar90 [16];
  
  pcVar25 = getenv("SECP256K1_BENCH_ITERS");
  if (pcVar25 == (char *)0x0) {
    uVar26 = 20000;
  }
  else {
    uVar26 = strtol(pcVar25,(char **)0x0,0);
  }
  bVar21 = true;
  if (argc != 1) {
    ppcVar34 = argv + 1;
    do {
      pcVar25 = *ppcVar34;
      lVar32 = 0;
      while (iVar22 = strcmp(pcVar25,*(char **)((long)&PTR_anon_var_dwarf_d5_00108d20 + lVar32)),
            iVar22 != 0) {
        lVar32 = lVar32 + 8;
        if (lVar32 == 0xa8) {
          bVar21 = false;
          goto LAB_001030c7;
        }
      }
      ppcVar34 = ppcVar34 + 1;
    } while (ppcVar34 != argv + argc);
    bVar21 = true;
  }
LAB_001030c7:
  lVar32 = (long)argc * 8;
  if (1 < argc) {
    lVar31 = 8;
    do {
      lVar46 = lVar31;
      if (lVar32 - lVar46 == 0) goto LAB_0010310a;
      pcVar25 = *(char **)((long)argv + lVar46);
      iVar22 = strcmp(pcVar25,"-h");
      iVar23 = (int)pcVar25;
      lVar31 = lVar46 + 8;
    } while (iVar22 != 0);
    if (lVar32 - lVar46 != 0) {
LAB_00103164:
      help(iVar23);
      return 0;
    }
LAB_0010310a:
    lVar31 = 8;
    do {
      lVar46 = lVar31;
      if (lVar32 - lVar46 == 0) goto LAB_00103137;
      pcVar25 = *(char **)((long)argv + lVar46);
      iVar22 = strcmp(pcVar25,"--help");
      iVar23 = (int)pcVar25;
      lVar31 = lVar46 + 8;
    } while (iVar22 != 0);
    if (lVar32 - lVar46 != 0) goto LAB_00103164;
LAB_00103137:
    lVar31 = 8;
    do {
      lVar46 = lVar31;
      if (lVar32 - lVar46 == 0) goto LAB_0010316e;
      pcVar25 = *(char **)((long)argv + lVar46);
      iVar22 = strcmp(pcVar25,"help");
      iVar23 = (int)pcVar25;
      lVar31 = lVar46 + 8;
    } while (iVar22 != 0);
    if (lVar32 - lVar46 != 0) goto LAB_00103164;
LAB_0010316e:
    if (!bVar21) {
      main_cold_1();
      return 1;
    }
  }
  lVar31 = 8;
  do {
    lVar46 = lVar31;
    if (lVar32 - lVar46 == 0) goto LAB_001031aa;
    iVar22 = strcmp(*(char **)((long)argv + lVar46),"recover");
    lVar31 = lVar46 + 8;
  } while (iVar22 != 0);
  if (lVar32 - lVar46 != 0) {
LAB_00103a45:
    main_cold_2();
    return 1;
  }
LAB_001031aa:
  lVar31 = 8;
  do {
    lVar46 = lVar31;
    if (lVar32 - lVar46 == 0) goto LAB_001031db;
    iVar22 = strcmp(*(char **)((long)argv + lVar46),"ecdsa_recover");
    lVar31 = lVar46 + 8;
  } while (iVar22 != 0);
  if (lVar32 - lVar46 != 0) goto LAB_00103a45;
LAB_001031db:
  local_1e0 = secp256k1_context_create(1);
  lVar31 = 8;
  auVar37 = _DAT_00105010;
  auVar54 = _DAT_00105020;
  auVar55 = _DAT_00105030;
  auVar56 = _DAT_00105040;
  auVar57 = _DAT_00105050;
  auVar58 = _DAT_00105060;
  auVar59 = _DAT_00105070;
  auVar60 = _DAT_00105080;
  do {
    auVar69 = auVar60 & _DAT_00105090;
    auVar81 = auVar59 & _DAT_00105090;
    sVar9 = auVar69._0_2_;
    cVar44 = (0 < sVar9) * (sVar9 < 0x100) * auVar69[0] - (0xff < sVar9);
    sVar9 = auVar69._2_2_;
    sVar61 = CONCAT11((0 < sVar9) * (sVar9 < 0x100) * auVar69[2] - (0xff < sVar9),cVar44);
    sVar9 = auVar69._4_2_;
    cVar36 = (0 < sVar9) * (sVar9 < 0x100) * auVar69[4] - (0xff < sVar9);
    sVar9 = auVar69._6_2_;
    uVar63 = CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar69[6] - (0xff < sVar9),
                      CONCAT12(cVar36,sVar61));
    sVar9 = auVar69._8_2_;
    cVar38 = (0 < sVar9) * (sVar9 < 0x100) * auVar69[8] - (0xff < sVar9);
    sVar9 = auVar69._10_2_;
    uVar64 = CONCAT15((0 < sVar9) * (sVar9 < 0x100) * auVar69[10] - (0xff < sVar9),
                      CONCAT14(cVar38,uVar63));
    sVar9 = auVar69._12_2_;
    cVar39 = (0 < sVar9) * (sVar9 < 0x100) * auVar69[0xc] - (0xff < sVar9);
    sVar9 = auVar69._14_2_;
    uVar33 = CONCAT17((0 < sVar9) * (sVar9 < 0x100) * auVar69[0xe] - (0xff < sVar9),
                      CONCAT16(cVar39,uVar64));
    sVar9 = auVar81._0_2_;
    cVar40 = (0 < sVar9) * (sVar9 < 0x100) * auVar81[0] - (0xff < sVar9);
    sVar9 = auVar81._2_2_;
    auVar65._0_10_ =
         CONCAT19((0 < sVar9) * (sVar9 < 0x100) * auVar81[2] - (0xff < sVar9),
                  CONCAT18(cVar40,uVar33));
    sVar9 = auVar81._4_2_;
    cVar41 = (0 < sVar9) * (sVar9 < 0x100) * auVar81[4] - (0xff < sVar9);
    auVar65[10] = cVar41;
    sVar9 = auVar81._6_2_;
    auVar65[0xb] = (0 < sVar9) * (sVar9 < 0x100) * auVar81[6] - (0xff < sVar9);
    sVar9 = auVar81._8_2_;
    cVar42 = (0 < sVar9) * (sVar9 < 0x100) * auVar81[8] - (0xff < sVar9);
    auVar67[0xc] = cVar42;
    auVar67._0_12_ = auVar65;
    sVar9 = auVar81._10_2_;
    auVar67[0xd] = (0 < sVar9) * (sVar9 < 0x100) * auVar81[10] - (0xff < sVar9);
    sVar9 = auVar81._12_2_;
    cVar43 = (0 < sVar9) * (sVar9 < 0x100) * auVar81[0xc] - (0xff < sVar9);
    auVar69[0xe] = cVar43;
    auVar69._0_14_ = auVar67;
    sVar9 = auVar81._14_2_;
    auVar69[0xf] = (0 < sVar9) * (sVar9 < 0x100) * auVar81[0xe] - (0xff < sVar9);
    auVar81 = auVar58 & _DAT_00105090;
    auVar88 = auVar57 & _DAT_00105090;
    sVar9 = auVar81._0_2_;
    cVar53 = (0 < sVar9) * (sVar9 < 0x100) * auVar81[0] - (0xff < sVar9);
    sVar9 = auVar81._2_2_;
    sVar70 = CONCAT11((0 < sVar9) * (sVar9 < 0x100) * auVar81[2] - (0xff < sVar9),cVar53);
    sVar9 = auVar81._4_2_;
    cVar52 = (0 < sVar9) * (sVar9 < 0x100) * auVar81[4] - (0xff < sVar9);
    sVar9 = auVar81._6_2_;
    uVar72 = CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar81[6] - (0xff < sVar9),
                      CONCAT12(cVar52,sVar70));
    sVar9 = auVar81._8_2_;
    cVar45 = (0 < sVar9) * (sVar9 < 0x100) * auVar81[8] - (0xff < sVar9);
    sVar9 = auVar81._10_2_;
    uVar73 = CONCAT15((0 < sVar9) * (sVar9 < 0x100) * auVar81[10] - (0xff < sVar9),
                      CONCAT14(cVar45,uVar72));
    sVar9 = auVar81._12_2_;
    cVar51 = (0 < sVar9) * (sVar9 < 0x100) * auVar81[0xc] - (0xff < sVar9);
    sVar9 = auVar81._14_2_;
    uVar74 = CONCAT17((0 < sVar9) * (sVar9 < 0x100) * auVar81[0xe] - (0xff < sVar9),
                      CONCAT16(cVar51,uVar73));
    sVar9 = auVar88._0_2_;
    cVar50 = (0 < sVar9) * (sVar9 < 0x100) * auVar88[0] - (0xff < sVar9);
    sVar9 = auVar88._2_2_;
    auVar75._0_10_ =
         CONCAT19((0 < sVar9) * (sVar9 < 0x100) * auVar88[2] - (0xff < sVar9),
                  CONCAT18(cVar50,uVar74));
    sVar9 = auVar88._4_2_;
    cVar49 = (0 < sVar9) * (sVar9 < 0x100) * auVar88[4] - (0xff < sVar9);
    auVar75[10] = cVar49;
    sVar9 = auVar88._6_2_;
    auVar75[0xb] = (0 < sVar9) * (sVar9 < 0x100) * auVar88[6] - (0xff < sVar9);
    sVar9 = auVar88._8_2_;
    cVar48 = (0 < sVar9) * (sVar9 < 0x100) * auVar88[8] - (0xff < sVar9);
    auVar78[0xc] = cVar48;
    auVar78._0_12_ = auVar75;
    sVar9 = auVar88._10_2_;
    auVar78[0xd] = (0 < sVar9) * (sVar9 < 0x100) * auVar88[10] - (0xff < sVar9);
    sVar9 = auVar88._12_2_;
    cVar47 = (0 < sVar9) * (sVar9 < 0x100) * auVar88[0xc] - (0xff < sVar9);
    auVar89[0xe] = cVar47;
    auVar89._0_14_ = auVar78;
    sVar9 = auVar88._14_2_;
    auVar89[0xf] = (0 < sVar9) * (sVar9 < 0x100) * auVar88[0xe] - (0xff < sVar9);
    cVar1 = (0 < sVar61) * (sVar61 < 0x100) * cVar44 - (0xff < sVar61);
    sVar9 = (short)((uint)uVar63 >> 0x10);
    sVar62 = CONCAT11((0 < sVar9) * (sVar9 < 0x100) * cVar36 - (0xff < sVar9),cVar1);
    sVar9 = (short)((uint6)uVar64 >> 0x20);
    cVar44 = (0 < sVar9) * (sVar9 < 0x100) * cVar38 - (0xff < sVar9);
    sVar9 = (short)((ulong)uVar33 >> 0x30);
    uVar63 = CONCAT13((0 < sVar9) * (sVar9 < 0x100) * cVar39 - (0xff < sVar9),
                      CONCAT12(cVar44,sVar62));
    sVar9 = (short)((unkuint10)auVar65._0_10_ >> 0x40);
    cVar36 = (0 < sVar9) * (sVar9 < 0x100) * cVar40 - (0xff < sVar9);
    sVar9 = auVar65._10_2_;
    uVar64 = CONCAT15((0 < sVar9) * (sVar9 < 0x100) * cVar41 - (0xff < sVar9),
                      CONCAT14(cVar36,uVar63));
    sVar9 = auVar67._12_2_;
    cVar42 = (0 < sVar9) * (sVar9 < 0x100) * cVar42 - (0xff < sVar9);
    sVar9 = auVar69._14_2_;
    uVar33 = CONCAT17((0 < sVar9) * (sVar9 < 0x100) * cVar43 - (0xff < sVar9),
                      CONCAT16(cVar42,uVar64));
    cVar41 = (0 < sVar70) * (sVar70 < 0x100) * cVar53 - (0xff < sVar70);
    sVar9 = (short)((uint)uVar72 >> 0x10);
    auVar66._0_10_ =
         CONCAT19((0 < sVar9) * (sVar9 < 0x100) * cVar52 - (0xff < sVar9),CONCAT18(cVar41,uVar33));
    sVar9 = (short)((uint6)uVar73 >> 0x20);
    cVar40 = (0 < sVar9) * (sVar9 < 0x100) * cVar45 - (0xff < sVar9);
    auVar66[10] = cVar40;
    sVar9 = (short)((ulong)uVar74 >> 0x30);
    auVar66[0xb] = (0 < sVar9) * (sVar9 < 0x100) * cVar51 - (0xff < sVar9);
    sVar9 = (short)((unkuint10)auVar75._0_10_ >> 0x40);
    cVar39 = (0 < sVar9) * (sVar9 < 0x100) * cVar50 - (0xff < sVar9);
    auVar68[0xc] = cVar39;
    auVar68._0_12_ = auVar66;
    sVar9 = auVar75._10_2_;
    auVar68[0xd] = (0 < sVar9) * (sVar9 < 0x100) * cVar49 - (0xff < sVar9);
    sVar9 = auVar78._12_2_;
    cVar38 = (0 < sVar9) * (sVar9 < 0x100) * cVar48 - (0xff < sVar9);
    auVar81[0xe] = cVar38;
    auVar81._0_14_ = auVar68;
    sVar9 = auVar89._14_2_;
    auVar81[0xf] = (0 < sVar9) * (sVar9 < 0x100) * cVar47 - (0xff < sVar9);
    auVar69 = auVar56 & _DAT_00105090;
    auVar89 = auVar55 & _DAT_00105090;
    sVar9 = auVar69._0_2_;
    cVar43 = (0 < sVar9) * (sVar9 < 0x100) * auVar69[0] - (0xff < sVar9);
    sVar9 = auVar69._2_2_;
    sVar61 = CONCAT11((0 < sVar9) * (sVar9 < 0x100) * auVar69[2] - (0xff < sVar9),cVar43);
    sVar9 = auVar69._4_2_;
    cVar45 = (0 < sVar9) * (sVar9 < 0x100) * auVar69[4] - (0xff < sVar9);
    sVar9 = auVar69._6_2_;
    uVar72 = CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar69[6] - (0xff < sVar9),
                      CONCAT12(cVar45,sVar61));
    sVar9 = auVar69._8_2_;
    cVar47 = (0 < sVar9) * (sVar9 < 0x100) * auVar69[8] - (0xff < sVar9);
    sVar9 = auVar69._10_2_;
    uVar73 = CONCAT15((0 < sVar9) * (sVar9 < 0x100) * auVar69[10] - (0xff < sVar9),
                      CONCAT14(cVar47,uVar72));
    sVar9 = auVar69._12_2_;
    cVar48 = (0 < sVar9) * (sVar9 < 0x100) * auVar69[0xc] - (0xff < sVar9);
    sVar9 = auVar69._14_2_;
    uVar74 = CONCAT17((0 < sVar9) * (sVar9 < 0x100) * auVar69[0xe] - (0xff < sVar9),
                      CONCAT16(cVar48,uVar73));
    sVar9 = auVar89._0_2_;
    cVar49 = (0 < sVar9) * (sVar9 < 0x100) * auVar89[0] - (0xff < sVar9);
    sVar9 = auVar89._2_2_;
    auVar76._0_10_ =
         CONCAT19((0 < sVar9) * (sVar9 < 0x100) * auVar89[2] - (0xff < sVar9),
                  CONCAT18(cVar49,uVar74));
    sVar9 = auVar89._4_2_;
    cVar50 = (0 < sVar9) * (sVar9 < 0x100) * auVar89[4] - (0xff < sVar9);
    auVar76[10] = cVar50;
    sVar9 = auVar89._6_2_;
    auVar76[0xb] = (0 < sVar9) * (sVar9 < 0x100) * auVar89[6] - (0xff < sVar9);
    sVar9 = auVar89._8_2_;
    cVar51 = (0 < sVar9) * (sVar9 < 0x100) * auVar89[8] - (0xff < sVar9);
    auVar79[0xc] = cVar51;
    auVar79._0_12_ = auVar76;
    sVar9 = auVar89._10_2_;
    auVar79[0xd] = (0 < sVar9) * (sVar9 < 0x100) * auVar89[10] - (0xff < sVar9);
    sVar9 = auVar89._12_2_;
    cVar52 = (0 < sVar9) * (sVar9 < 0x100) * auVar89[0xc] - (0xff < sVar9);
    auVar88[0xe] = cVar52;
    auVar88._0_14_ = auVar79;
    sVar9 = auVar89._14_2_;
    auVar88[0xf] = (0 < sVar9) * (sVar9 < 0x100) * auVar89[0xe] - (0xff < sVar9);
    auVar69 = auVar54 & _DAT_00105090;
    auVar89 = auVar37 & _DAT_00105090;
    sVar9 = auVar69._0_2_;
    cVar53 = (0 < sVar9) * (sVar9 < 0x100) * auVar69[0] - (0xff < sVar9);
    sVar9 = auVar69._2_2_;
    sVar70 = CONCAT11((0 < sVar9) * (sVar9 < 0x100) * auVar69[2] - (0xff < sVar9),cVar53);
    sVar9 = auVar69._4_2_;
    cVar2 = (0 < sVar9) * (sVar9 < 0x100) * auVar69[4] - (0xff < sVar9);
    sVar9 = auVar69._6_2_;
    uVar83 = CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar69[6] - (0xff < sVar9),
                      CONCAT12(cVar2,sVar70));
    sVar9 = auVar69._8_2_;
    cVar3 = (0 < sVar9) * (sVar9 < 0x100) * auVar69[8] - (0xff < sVar9);
    sVar9 = auVar69._10_2_;
    uVar84 = CONCAT15((0 < sVar9) * (sVar9 < 0x100) * auVar69[10] - (0xff < sVar9),
                      CONCAT14(cVar3,uVar83));
    sVar9 = auVar69._12_2_;
    cVar4 = (0 < sVar9) * (sVar9 < 0x100) * auVar69[0xc] - (0xff < sVar9);
    sVar9 = auVar69._14_2_;
    uVar85 = CONCAT17((0 < sVar9) * (sVar9 < 0x100) * auVar69[0xe] - (0xff < sVar9),
                      CONCAT16(cVar4,uVar84));
    sVar9 = auVar89._0_2_;
    cVar5 = (0 < sVar9) * (sVar9 < 0x100) * auVar89[0] - (0xff < sVar9);
    sVar9 = auVar89._2_2_;
    auVar86._0_10_ =
         CONCAT19((0 < sVar9) * (sVar9 < 0x100) * auVar89[2] - (0xff < sVar9),CONCAT18(cVar5,uVar85)
                 );
    sVar9 = auVar89._4_2_;
    cVar6 = (0 < sVar9) * (sVar9 < 0x100) * auVar89[4] - (0xff < sVar9);
    auVar86[10] = cVar6;
    sVar9 = auVar89._6_2_;
    auVar86[0xb] = (0 < sVar9) * (sVar9 < 0x100) * auVar89[6] - (0xff < sVar9);
    sVar9 = auVar89._8_2_;
    cVar7 = (0 < sVar9) * (sVar9 < 0x100) * auVar89[8] - (0xff < sVar9);
    auVar87[0xc] = cVar7;
    auVar87._0_12_ = auVar86;
    sVar9 = auVar89._10_2_;
    auVar87[0xd] = (0 < sVar9) * (sVar9 < 0x100) * auVar89[10] - (0xff < sVar9);
    sVar9 = auVar89._12_2_;
    cVar8 = (0 < sVar9) * (sVar9 < 0x100) * auVar89[0xc] - (0xff < sVar9);
    auVar90[0xe] = cVar8;
    auVar90._0_14_ = auVar87;
    sVar9 = auVar89._14_2_;
    auVar90[0xf] = (0 < sVar9) * (sVar9 < 0x100) * auVar89[0xe] - (0xff < sVar9);
    cVar43 = (0 < sVar61) * (sVar61 < 0x100) * cVar43 - (0xff < sVar61);
    sVar9 = (short)((uint)uVar72 >> 0x10);
    sVar71 = CONCAT11((0 < sVar9) * (sVar9 < 0x100) * cVar45 - (0xff < sVar9),cVar43);
    sVar9 = (short)((uint6)uVar73 >> 0x20);
    cVar45 = (0 < sVar9) * (sVar9 < 0x100) * cVar47 - (0xff < sVar9);
    sVar9 = (short)((ulong)uVar74 >> 0x30);
    uVar72 = CONCAT13((0 < sVar9) * (sVar9 < 0x100) * cVar48 - (0xff < sVar9),
                      CONCAT12(cVar45,sVar71));
    sVar9 = (short)((unkuint10)auVar76._0_10_ >> 0x40);
    cVar47 = (0 < sVar9) * (sVar9 < 0x100) * cVar49 - (0xff < sVar9);
    sVar9 = auVar76._10_2_;
    uVar73 = CONCAT15((0 < sVar9) * (sVar9 < 0x100) * cVar50 - (0xff < sVar9),
                      CONCAT14(cVar47,uVar72));
    sVar9 = auVar79._12_2_;
    cVar48 = (0 < sVar9) * (sVar9 < 0x100) * cVar51 - (0xff < sVar9);
    sVar9 = auVar88._14_2_;
    uVar74 = CONCAT17((0 < sVar9) * (sVar9 < 0x100) * cVar52 - (0xff < sVar9),
                      CONCAT16(cVar48,uVar73));
    cVar49 = (0 < sVar70) * (sVar70 < 0x100) * cVar53 - (0xff < sVar70);
    sVar9 = (short)((uint)uVar83 >> 0x10);
    auVar77._0_10_ =
         CONCAT19((0 < sVar9) * (sVar9 < 0x100) * cVar2 - (0xff < sVar9),CONCAT18(cVar49,uVar74));
    sVar9 = (short)((uint6)uVar84 >> 0x20);
    cVar50 = (0 < sVar9) * (sVar9 < 0x100) * cVar3 - (0xff < sVar9);
    auVar77[10] = cVar50;
    sVar9 = (short)((ulong)uVar85 >> 0x30);
    auVar77[0xb] = (0 < sVar9) * (sVar9 < 0x100) * cVar4 - (0xff < sVar9);
    sVar9 = (short)((unkuint10)auVar86._0_10_ >> 0x40);
    cVar51 = (0 < sVar9) * (sVar9 < 0x100) * cVar5 - (0xff < sVar9);
    auVar80[0xc] = cVar51;
    auVar80._0_12_ = auVar77;
    sVar9 = auVar86._10_2_;
    auVar80[0xd] = (0 < sVar9) * (sVar9 < 0x100) * cVar6 - (0xff < sVar9);
    sVar9 = auVar87._12_2_;
    cVar52 = (0 < sVar9) * (sVar9 < 0x100) * cVar7 - (0xff < sVar9);
    auVar82[0xe] = cVar52;
    auVar82._0_14_ = auVar80;
    sVar9 = auVar90._14_2_;
    auVar82[0xf] = (0 < sVar9) * (sVar9 < 0x100) * cVar8 - (0xff < sVar9);
    sVar9 = (short)((uint)uVar63 >> 0x10);
    sVar61 = (short)((uint6)uVar64 >> 0x20);
    sVar70 = (short)((ulong)uVar33 >> 0x30);
    sVar10 = (short)((unkuint10)auVar66._0_10_ >> 0x40);
    sVar11 = auVar66._10_2_;
    sVar12 = auVar68._12_2_;
    sVar13 = auVar81._14_2_;
    sVar14 = (short)((uint)uVar72 >> 0x10);
    sVar15 = (short)((uint6)uVar73 >> 0x20);
    sVar16 = (short)((ulong)uVar74 >> 0x30);
    sVar17 = (short)((unkuint10)auVar77._0_10_ >> 0x40);
    sVar18 = auVar77._10_2_;
    sVar19 = auVar80._12_2_;
    sVar20 = auVar82._14_2_;
    local_1d8[lVar31 + -8] = ((0 < sVar62) * (sVar62 < 0x100) * cVar1 - (0xff < sVar62)) + '\x01';
    local_1d8[lVar31 + -7] = ((0 < sVar9) * (sVar9 < 0x100) * cVar44 - (0xff < sVar9)) + '\x01';
    local_1d8[lVar31 + -6] = ((0 < sVar61) * (sVar61 < 0x100) * cVar36 - (0xff < sVar61)) + '\x01';
    local_1d8[lVar31 + -5] = ((0 < sVar70) * (sVar70 < 0x100) * cVar42 - (0xff < sVar70)) + '\x01';
    local_1d8[lVar31 + -4] = ((0 < sVar10) * (sVar10 < 0x100) * cVar41 - (0xff < sVar10)) + '\x01';
    local_1d8[lVar31 + -3] = ((0 < sVar11) * (sVar11 < 0x100) * cVar40 - (0xff < sVar11)) + '\x01';
    local_1d8[lVar31 + -2] = ((0 < sVar12) * (sVar12 < 0x100) * cVar39 - (0xff < sVar12)) + '\x01';
    local_1d8[lVar31 + -1] = ((0 < sVar13) * (sVar13 < 0x100) * cVar38 - (0xff < sVar13)) + '\x01';
    local_1d8[lVar31] = ((0 < sVar71) * (sVar71 < 0x100) * cVar43 - (0xff < sVar71)) + '\x01';
    local_1d8[lVar31 + 1] = ((0 < sVar14) * (sVar14 < 0x100) * cVar45 - (0xff < sVar14)) + '\x01';
    local_1d8[lVar31 + 2] = ((0 < sVar15) * (sVar15 < 0x100) * cVar47 - (0xff < sVar15)) + '\x01';
    local_1d8[lVar31 + 3] = ((0 < sVar16) * (sVar16 < 0x100) * cVar48 - (0xff < sVar16)) + '\x01';
    local_1d8[lVar31 + 4] = ((0 < sVar17) * (sVar17 < 0x100) * cVar49 - (0xff < sVar17)) + '\x01';
    local_1d8[lVar31 + 5] = ((0 < sVar18) * (sVar18 < 0x100) * cVar50 - (0xff < sVar18)) + '\x01';
    local_1d8[lVar31 + 6] = ((0 < sVar19) * (sVar19 < 0x100) * cVar51 - (0xff < sVar19)) + '\x01';
    local_1d8[lVar31 + 7] = ((0 < sVar20) * (sVar20 < 0x100) * cVar52 - (0xff < sVar20)) + '\x01';
    lVar46 = auVar60._8_8_;
    auVar60._0_8_ = auVar60._0_8_ + 0x10;
    auVar60._8_8_ = lVar46 + 0x10;
    lVar46 = auVar59._8_8_;
    auVar59._0_8_ = auVar59._0_8_ + 0x10;
    auVar59._8_8_ = lVar46 + 0x10;
    lVar46 = auVar58._8_8_;
    auVar58._0_8_ = auVar58._0_8_ + 0x10;
    auVar58._8_8_ = lVar46 + 0x10;
    lVar46 = auVar57._8_8_;
    auVar57._0_8_ = auVar57._0_8_ + 0x10;
    auVar57._8_8_ = lVar46 + 0x10;
    lVar46 = auVar56._8_8_;
    auVar56._0_8_ = auVar56._0_8_ + 0x10;
    auVar56._8_8_ = lVar46 + 0x10;
    lVar46 = auVar55._8_8_;
    auVar55._0_8_ = auVar55._0_8_ + 0x10;
    auVar55._8_8_ = lVar46 + 0x10;
    lVar46 = auVar54._8_8_;
    auVar54._0_8_ = auVar54._0_8_ + 0x10;
    auVar54._8_8_ = lVar46 + 0x10;
    lVar46 = auVar37._8_8_;
    auVar37._0_8_ = auVar37._0_8_ + 0x10;
    auVar37._8_8_ = lVar46 + 0x10;
    lVar31 = lVar31 + 0x10;
  } while (lVar31 != 0x28);
  cVar36 = '\0';
  cVar38 = '\x01';
  cVar39 = '\x02';
  cVar40 = '\x03';
  cVar41 = '\x04';
  cVar42 = '\x05';
  cVar43 = '\x06';
  cVar44 = '\a';
  cVar45 = '\b';
  cVar47 = '\t';
  cVar48 = '\n';
  cVar49 = '\v';
  cVar50 = '\f';
  cVar51 = '\r';
  cVar52 = '\x0e';
  cVar53 = '\x0f';
  lVar31 = 0x28;
  do {
    local_1d8[lVar31 + -8] = cVar36 + DAT_001050c0;
    local_1d8[lVar31 + -7] = cVar38 + DAT_001050c0._1_1_;
    local_1d8[lVar31 + -6] = cVar39 + DAT_001050c0._2_1_;
    local_1d8[lVar31 + -5] = cVar40 + DAT_001050c0._3_1_;
    local_1d8[lVar31 + -4] = cVar41 + DAT_001050c0._4_1_;
    local_1d8[lVar31 + -3] = cVar42 + DAT_001050c0._5_1_;
    local_1d8[lVar31 + -2] = cVar43 + DAT_001050c0._6_1_;
    local_1d8[lVar31 + -1] = cVar44 + DAT_001050c0._7_1_;
    local_1d8[lVar31] = cVar45 + DAT_001050c0._8_1_;
    local_1d8[lVar31 + 1] = cVar47 + DAT_001050c0._9_1_;
    local_1d8[lVar31 + 2] = cVar48 + DAT_001050c0._10_1_;
    local_1d8[lVar31 + 3] = cVar49 + DAT_001050c0._11_1_;
    local_1d8[lVar31 + 4] = cVar50 + DAT_001050c0._12_1_;
    local_1d8[lVar31 + 5] = cVar51 + DAT_001050c0._13_1_;
    local_1d8[lVar31 + 6] = cVar52 + DAT_001050c0._14_1_;
    local_1d8[lVar31 + 7] = cVar53 + DAT_001050c0._15_1_;
    cVar36 = cVar36 + DAT_001050d0;
    cVar38 = cVar38 + DAT_001050d0._1_1_;
    cVar39 = cVar39 + DAT_001050d0._2_1_;
    cVar40 = cVar40 + DAT_001050d0._3_1_;
    cVar41 = cVar41 + DAT_001050d0._4_1_;
    cVar42 = cVar42 + DAT_001050d0._5_1_;
    cVar43 = cVar43 + DAT_001050d0._6_1_;
    cVar44 = cVar44 + DAT_001050d0._7_1_;
    cVar45 = cVar45 + DAT_001050d0._8_1_;
    cVar47 = cVar47 + DAT_001050d0._9_1_;
    cVar48 = cVar48 + DAT_001050d0._10_1_;
    cVar49 = cVar49 + DAT_001050d0._11_1_;
    cVar50 = cVar50 + DAT_001050d0._12_1_;
    cVar51 = cVar51 + DAT_001050d0._13_1_;
    cVar52 = cVar52 + DAT_001050d0._14_1_;
    cVar53 = cVar53 + DAT_001050d0._15_1_;
    lVar31 = lVar31 + 0x10;
  } while (lVar31 != 0x48);
  local_150 = 0x48;
  uVar33 = 0;
  iVar22 = secp256k1_ecdsa_sign(local_1e0,local_b0,local_1d8,local_1b8,0);
  if (iVar22 == 0) {
LAB_00103a6c:
    main_cold_10();
LAB_00103a71:
    main_cold_9();
  }
  else {
    iVar22 = secp256k1_ecdsa_signature_serialize_der(local_1e0,local_198,&local_150,local_b0);
    if (iVar22 == 0) goto LAB_00103a71;
    iVar22 = secp256k1_ec_pubkey_create(local_1e0,local_70,local_1b8);
    if (iVar22 != 0) {
      local_120 = 0x21;
      iVar22 = secp256k1_ec_pubkey_serialize(local_1e0,local_148,&local_120,local_70,0x102);
      if (iVar22 != 1) goto LAB_00103a7b;
      printf("%-30s,%-15s,%-15s,%-15s\n","Benchmark","    Min(us)    ","    Avg(us)    ",
             "    Max(us)    ");
      putchar(10);
      iVar22 = (int)uVar26;
      if (argc == 1) {
LAB_001034c3:
        run_benchmark("ecdsa_verify",bench_verify,(_func_void_void_ptr *)0x0,
                      (_func_void_void_ptr_int *)&local_1e0,(void *)(uVar26 & 0xffffffff),
                      (int)uVar33,in_stack_fffffffffffffd98);
      }
      else {
        lVar31 = 8;
        do {
          lVar46 = lVar31;
          if (lVar32 - lVar46 == 0) goto LAB_00103469;
          iVar23 = strcmp(*(char **)((long)argv + lVar46),"ecdsa");
          lVar31 = lVar46 + 8;
        } while (iVar23 != 0);
        if (lVar32 - lVar46 != 0) goto LAB_001034c3;
LAB_00103469:
        lVar31 = 8;
        do {
          lVar46 = lVar31;
          if (lVar32 - lVar46 == 0) goto LAB_00103496;
          iVar23 = strcmp(*(char **)((long)argv + lVar46),"verify");
          lVar31 = lVar46 + 8;
        } while (iVar23 != 0);
        if (lVar32 - lVar46 != 0) goto LAB_001034c3;
LAB_00103496:
        lVar31 = 8;
        do {
          lVar46 = lVar31;
          if (lVar32 - lVar46 == 0) goto LAB_001034e3;
          iVar23 = strcmp(*(char **)((long)argv + lVar46),"ecdsa_verify");
          lVar31 = lVar46 + 8;
        } while (iVar23 != 0);
        if (lVar32 - lVar46 != 0) goto LAB_001034c3;
      }
LAB_001034e3:
      if (argc == 1) {
LAB_00103573:
        run_benchmark("ecdsa_sign",bench_sign_run,bench_sign_setup,
                      (_func_void_void_ptr_int *)&local_1e0,(void *)(uVar26 & 0xffffffff),
                      (int)uVar33,in_stack_fffffffffffffd98);
      }
      else {
        lVar31 = 8;
        do {
          lVar46 = lVar31;
          if (lVar32 - lVar46 == 0) goto LAB_00103519;
          iVar23 = strcmp(*(char **)((long)argv + lVar46),"ecdsa");
          lVar31 = lVar46 + 8;
        } while (iVar23 != 0);
        if (lVar32 - lVar46 != 0) goto LAB_00103573;
LAB_00103519:
        lVar31 = 8;
        do {
          lVar46 = lVar31;
          if (lVar32 - lVar46 == 0) goto LAB_00103546;
          iVar23 = strcmp(*(char **)((long)argv + lVar46),"sign");
          lVar31 = lVar46 + 8;
        } while (iVar23 != 0);
        if (lVar32 - lVar46 != 0) goto LAB_00103573;
LAB_00103546:
        lVar31 = 8;
        do {
          lVar46 = lVar31;
          if (lVar32 - lVar46 == 0) goto LAB_00103598;
          iVar23 = strcmp(*(char **)((long)argv + lVar46),"ecdsa_sign");
          lVar31 = lVar46 + 8;
        } while (iVar23 != 0);
        if (lVar32 - lVar46 != 0) goto LAB_00103573;
      }
LAB_00103598:
      if (argc == 1) {
LAB_00103628:
        run_benchmark("ec_keygen",bench_keygen_run,bench_keygen_setup,
                      (_func_void_void_ptr_int *)&local_1e0,(void *)(uVar26 & 0xffffffff),
                      (int)uVar33,in_stack_fffffffffffffd98);
      }
      else {
        lVar31 = 8;
        do {
          lVar46 = lVar31;
          if (lVar32 - lVar46 == 0) goto LAB_001035ce;
          iVar23 = strcmp(*(char **)((long)argv + lVar46),"ec");
          lVar31 = lVar46 + 8;
        } while (iVar23 != 0);
        if (lVar32 - lVar46 != 0) goto LAB_00103628;
LAB_001035ce:
        lVar31 = 8;
        do {
          lVar46 = lVar31;
          if (lVar32 - lVar46 == 0) goto LAB_001035fb;
          iVar23 = strcmp(*(char **)((long)argv + lVar46),"keygen");
          lVar31 = lVar46 + 8;
        } while (iVar23 != 0);
        if (lVar32 - lVar46 != 0) goto LAB_00103628;
LAB_001035fb:
        lVar31 = 8;
        do {
          lVar46 = lVar31;
          if (lVar32 - lVar46 == 0) goto LAB_0010364d;
          iVar23 = strcmp(*(char **)((long)argv + lVar46),"ec_keygen");
          lVar31 = lVar46 + 8;
        } while (iVar23 != 0);
        if (lVar32 - lVar46 != 0) goto LAB_00103628;
      }
LAB_0010364d:
      secp256k1_context_destroy(local_1e0);
      local_118[0] = secp256k1_context_create(1);
      if (argc != 1) {
        lVar31 = 8;
        do {
          if (lVar32 - lVar31 == 0) goto LAB_001036bc;
          iVar23 = strcmp(*(char **)((long)argv + lVar31),"ecdh");
          lVar31 = lVar31 + 8;
        } while (iVar23 != 0);
      }
      run_benchmark("ecdh",bench_ecdh,bench_ecdh_setup,(_func_void_void_ptr_int *)local_118,
                    (void *)(uVar26 & 0xffffffff),(int)uVar33,in_stack_fffffffffffffd98);
LAB_001036bc:
      local_210 = lVar32;
      secp256k1_context_destroy(local_118[0]);
      local_240[0] = secp256k1_context_create(1);
      __size = (long)iVar22 << 3;
      local_230 = malloc(__size);
      local_228 = malloc(__size);
      local_218 = malloc(__size);
      local_220 = malloc(__size);
      if (0 < iVar22) {
        uVar35 = 0;
        do {
          puVar27 = (undefined1 *)malloc(0x20);
          pvVar28 = malloc(0x40);
          pvVar29 = malloc(0x60);
          pvVar30 = malloc(0x20);
          local_208 = (undefined1)uVar35;
          *puVar27 = local_208;
          local_207 = (undefined1)(uVar35 >> 8);
          puVar27[1] = local_207;
          local_206 = (undefined1)(uVar35 >> 0x10);
          puVar27[2] = local_206;
          local_205 = (undefined1)(uVar35 >> 0x18);
          puVar27[3] = local_205;
          *(undefined8 *)(puVar27 + 4) = 0x6d6d6d6d6d6d6d6d;
          *(undefined8 *)(puVar27 + 0xc) = 0x6d6d6d6d6d6d6d6d;
          *(undefined8 *)(puVar27 + 0x10) = 0x6d6d6d6d6d6d6d6d;
          *(undefined8 *)(puVar27 + 0x18) = 0x6d6d6d6d6d6d6d6d;
          uStack_1f4 = 0x73737373;
          uStack_1f0 = 0x7373737373737373;
          local_204 = 0x7373737373737373;
          uStack_1fc = 0x73737373;
          uStack_1f8 = 0x73737373;
          *(void **)((long)local_230 + uVar35 * 8) = pvVar29;
          *(void **)((long)local_228 + uVar35 * 8) = pvVar30;
          *(undefined1 **)((long)local_218 + uVar35 * 8) = puVar27;
          *(void **)((long)local_220 + uVar35 * 8) = pvVar28;
          iVar23 = secp256k1_keypair_create(local_240[0],pvVar29,&local_208);
          if (iVar23 == 0) {
            main_cold_7();
LAB_00103a5d:
            main_cold_6();
LAB_00103a62:
            main_cold_5();
LAB_00103a67:
            main_cold_4();
            goto LAB_00103a6c;
          }
          uVar33 = 0;
          iVar23 = secp256k1_schnorrsig_sign_custom(local_240[0],pvVar28,puVar27,0x20,pvVar29);
          if (iVar23 == 0) goto LAB_00103a5d;
          iVar23 = secp256k1_keypair_xonly_pub(local_240[0],local_118,0,pvVar29);
          if (iVar23 == 0) goto LAB_00103a62;
          iVar23 = secp256k1_xonly_pubkey_serialize(local_240[0],pvVar30,local_118);
          if (iVar23 != 1) goto LAB_00103a67;
          uVar35 = uVar35 + 1;
        } while ((uVar26 & 0xffffffff) != uVar35);
      }
      lVar32 = local_210;
      if (argc != 1) {
        lVar31 = 8;
        do {
          if (lVar32 == lVar31) {
            lVar31 = 8;
            goto LAB_001038b0;
          }
          iVar23 = strcmp(*(char **)((long)argv + lVar31),"schnorrsig");
          lVar31 = lVar31 + 8;
        } while (iVar23 != 0);
      }
      goto LAB_001038f1;
    }
  }
  main_cold_8();
LAB_00103a7b:
  main_cold_3();
  puts("Benchmarks the following algorithms:");
  puts("    - ECDSA signing/verification");
  puts("    - ECDH key exchange (optional module)");
  puts("    - Schnorr signatures (optional module)");
  puts("    - ElligatorSwift (optional module)");
  putchar(10);
  printf("The default number of iterations for each benchmark is %d. This can be\n",20000);
  puts("customized using the SECP256K1_BENCH_ITERS environment variable.");
  putchar(10);
  puts("Usage: ./bench [args]");
  puts("By default, all benchmarks will be run.");
  puts("args:");
  puts("    help              : display this help and exit");
  puts("    ecdsa             : all ECDSA algorithms--sign, verify, recovery (if enabled)");
  puts("    ecdsa_sign        : ECDSA siging algorithm");
  puts("    ecdsa_verify      : ECDSA verification algorithm");
  puts("    ec                : all EC public key algorithms (keygen)");
  puts("    ec_keygen         : EC public key generation");
  puts("    ecdh              : ECDH key exchange algorithm");
  puts("    schnorrsig        : all Schnorr signature algorithms (sign, verify)");
  puts("    schnorrsig_sign   : Schnorr sigining algorithm");
  puts("    schnorrsig_verify : Schnorr verification algorithm");
  puts("    ellswift          : all ElligatorSwift benchmarks (encode, decode, keygen, ecdh)");
  puts("    ellswift_encode   : ElligatorSwift encoding");
  puts("    ellswift_decode   : ElligatorSwift decoding");
  puts("    ellswift_keygen   : ElligatorSwift key generation");
  puts("    ellswift_ecdh     : ECDH on ElligatorSwift keys");
  iVar22 = putchar(10);
  return iVar22;
  while( true ) {
    iVar23 = strcmp(*(char **)((long)argv + lVar31),"sign");
    lVar31 = lVar31 + 8;
    if (iVar23 == 0) break;
LAB_001038b0:
    if (lVar32 == lVar31) {
      lVar31 = 8;
      goto LAB_001038d8;
    }
  }
  goto LAB_001038f1;
  while( true ) {
    iVar24 = strcmp(*(char **)((long)argv + lVar31),"verify");
    iVar23 = (int)uVar33;
    lVar31 = lVar31 + 8;
    if (iVar24 == 0) break;
LAB_00103948:
    if (lVar32 == lVar31) {
      lVar31 = 8;
      goto LAB_00103970;
    }
  }
  goto LAB_00103989;
  while( true ) {
    iVar24 = strcmp(*(char **)((long)argv + lVar31),"schnorrsig_verify");
    iVar23 = (int)uVar33;
    lVar31 = lVar31 + 8;
    if (iVar24 == 0) break;
LAB_00103970:
    if (lVar32 == lVar31) goto LAB_001039a6;
  }
  goto LAB_00103989;
  while( true ) {
    iVar23 = strcmp(*(char **)((long)argv + lVar31),"schnorrsig_sign");
    lVar31 = lVar31 + 8;
    if (iVar23 == 0) break;
LAB_001038d8:
    if (lVar32 == lVar31) goto LAB_0010390e;
  }
LAB_001038f1:
  run_benchmark("schnorrsig_sign",bench_schnorrsig_sign,(_func_void_void_ptr *)0x0,
                (_func_void_void_ptr_int *)local_240,(void *)(uVar26 & 0xffffffff),(int)uVar33,
                in_stack_fffffffffffffd98);
LAB_0010390e:
  iVar23 = (int)uVar33;
  if (argc != 1) {
    lVar31 = 8;
    do {
      if (lVar32 == lVar31) {
        lVar31 = 8;
        goto LAB_00103948;
      }
      iVar24 = strcmp(*(char **)((long)argv + lVar31),"schnorrsig");
      iVar23 = (int)uVar33;
      lVar31 = lVar31 + 8;
    } while (iVar24 != 0);
  }
LAB_00103989:
  run_benchmark("schnorrsig_verify",bench_schnorrsig_verify,(_func_void_void_ptr *)0x0,
                (_func_void_void_ptr_int *)local_240,(void *)(uVar26 & 0xffffffff),iVar23,
                in_stack_fffffffffffffd98);
LAB_001039a6:
  if (0 < iVar22) {
    uVar35 = 0;
    do {
      free(*(void **)((long)local_230 + uVar35 * 8));
      free(*(void **)((long)local_228 + uVar35 * 8));
      free(*(void **)((long)local_218 + uVar35 * 8));
      free(*(void **)((long)local_220 + uVar35 * 8));
      uVar35 = uVar35 + 1;
    } while ((uVar26 & 0xffffffff) != uVar35);
  }
  free(local_230);
  free(local_228);
  free(local_218);
  free(local_220);
  secp256k1_context_destroy(local_240[0]);
  run_ellswift_bench(iVar22,argc,argv);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
    int i;
    secp256k1_pubkey pubkey;
    secp256k1_ecdsa_signature sig;
    bench_data data;

    int d = argc == 1;
    int default_iters = 20000;
    int iters = get_iters(default_iters);

    /* Check for invalid user arguments */
    char* valid_args[] = {"ecdsa", "verify", "ecdsa_verify", "sign", "ecdsa_sign", "ecdh", "recover",
                         "ecdsa_recover", "schnorrsig", "schnorrsig_verify", "schnorrsig_sign", "ec",
                         "keygen", "ec_keygen", "ellswift", "encode", "ellswift_encode", "decode",
                         "ellswift_decode", "ellswift_keygen", "ellswift_ecdh"};
    size_t valid_args_size = sizeof(valid_args)/sizeof(valid_args[0]);
    int invalid_args = have_invalid_args(argc, argv, valid_args, valid_args_size);

    if (argc > 1) {
        if (have_flag(argc, argv, "-h")
           || have_flag(argc, argv, "--help")
           || have_flag(argc, argv, "help")) {
            help(default_iters);
            return EXIT_SUCCESS;
        } else if (invalid_args) {
            fprintf(stderr, "./bench: unrecognized argument.\n\n");
            help(default_iters);
            return EXIT_FAILURE;
        }
    }

/* Check if the user tries to benchmark optional module without building it */
#ifndef ENABLE_MODULE_ECDH
    if (have_flag(argc, argv, "ecdh")) {
        fprintf(stderr, "./bench: ECDH module not enabled.\n");
        fprintf(stderr, "Use ./configure --enable-module-ecdh.\n\n");
        return EXIT_FAILURE;
    }
#endif

#ifndef ENABLE_MODULE_RECOVERY
    if (have_flag(argc, argv, "recover") || have_flag(argc, argv, "ecdsa_recover")) {
        fprintf(stderr, "./bench: Public key recovery module not enabled.\n");
        fprintf(stderr, "Use ./configure --enable-module-recovery.\n\n");
        return EXIT_FAILURE;
    }
#endif

#ifndef ENABLE_MODULE_SCHNORRSIG
    if (have_flag(argc, argv, "schnorrsig") || have_flag(argc, argv, "schnorrsig_sign") || have_flag(argc, argv, "schnorrsig_verify")) {
        fprintf(stderr, "./bench: Schnorr signatures module not enabled.\n");
        fprintf(stderr, "Use ./configure --enable-module-schnorrsig.\n\n");
        return EXIT_FAILURE;
    }
#endif

#ifndef ENABLE_MODULE_ELLSWIFT
    if (have_flag(argc, argv, "ellswift") || have_flag(argc, argv, "ellswift_encode") || have_flag(argc, argv, "ellswift_decode") ||
        have_flag(argc, argv, "encode") || have_flag(argc, argv, "decode") || have_flag(argc, argv, "ellswift_keygen") ||
        have_flag(argc, argv, "ellswift_ecdh")) {
        fprintf(stderr, "./bench: ElligatorSwift module not enabled.\n");
        fprintf(stderr, "Use ./configure --enable-module-ellswift.\n\n");
        return EXIT_FAILURE;
    }
#endif

    /* ECDSA benchmark */
    data.ctx = secp256k1_context_create(SECP256K1_CONTEXT_NONE);

    for (i = 0; i < 32; i++) {
        data.msg[i] = 1 + i;
    }
    for (i = 0; i < 32; i++) {
        data.key[i] = 33 + i;
    }
    data.siglen = 72;
    CHECK(secp256k1_ecdsa_sign(data.ctx, &sig, data.msg, data.key, NULL, NULL));
    CHECK(secp256k1_ecdsa_signature_serialize_der(data.ctx, data.sig, &data.siglen, &sig));
    CHECK(secp256k1_ec_pubkey_create(data.ctx, &pubkey, data.key));
    data.pubkeylen = 33;
    CHECK(secp256k1_ec_pubkey_serialize(data.ctx, data.pubkey, &data.pubkeylen, &pubkey, SECP256K1_EC_COMPRESSED) == 1);

    print_output_table_header_row();
    if (d || have_flag(argc, argv, "ecdsa") || have_flag(argc, argv, "verify") || have_flag(argc, argv, "ecdsa_verify")) run_benchmark("ecdsa_verify", bench_verify, NULL, NULL, &data, 10, iters);

    if (d || have_flag(argc, argv, "ecdsa") || have_flag(argc, argv, "sign") || have_flag(argc, argv, "ecdsa_sign")) run_benchmark("ecdsa_sign", bench_sign_run, bench_sign_setup, NULL, &data, 10, iters);
    if (d || have_flag(argc, argv, "ec") || have_flag(argc, argv, "keygen") || have_flag(argc, argv, "ec_keygen")) run_benchmark("ec_keygen", bench_keygen_run, bench_keygen_setup, NULL, &data, 10, iters);

    secp256k1_context_destroy(data.ctx);

#ifdef ENABLE_MODULE_ECDH
    /* ECDH benchmarks */
    run_ecdh_bench(iters, argc, argv);
#endif

#ifdef ENABLE_MODULE_RECOVERY
    /* ECDSA recovery benchmarks */
    run_recovery_bench(iters, argc, argv);
#endif

#ifdef ENABLE_MODULE_SCHNORRSIG
    /* Schnorr signature benchmarks */
    run_schnorrsig_bench(iters, argc, argv);
#endif

#ifdef ENABLE_MODULE_ELLSWIFT
    /* ElligatorSwift benchmarks */
    run_ellswift_bench(iters, argc, argv);
#endif

    return EXIT_SUCCESS;
}